

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiInputSource IVar7;
  int decimal_precision;
  float *pfVar8;
  longlong lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double local_80;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  uVar10 = data_type & 0xfffffffe;
  bVar13 = uVar10 != 8;
  bVar1 = v_max <= v_min;
  bVar2 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar11 = flags & 1;
  IVar7 = GImGui->ActiveIdSource;
  if (IVar7 == ImGuiInputSource_Mouse) {
    bVar6 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar6) || ((pIVar5->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar7 = pIVar5->ActiveIdSource;
      goto LAB_0016e1b9;
    }
    pfVar8 = ImVec2::operator[](&(pIVar5->IO).MouseDelta,(ulong)uVar11);
    fVar16 = *pfVar8;
    if ((pIVar5->IO).KeyAlt != false) {
      fVar16 = fVar16 * 0.01;
    }
    if ((pIVar5->IO).KeyShift == true) {
      fVar16 = fVar16 * 10.0;
    }
  }
  else {
LAB_0016e1b9:
    fVar16 = 0.0;
    if (IVar7 == ImGuiInputSource_Nav) {
      decimal_precision = 0;
      if (uVar10 == 8) {
        decimal_precision = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar8 = ImVec2::operator[](&local_38,(ulong)uVar11);
      fVar16 = *pfVar8;
      fVar15 = GetMinimumStepAtDecimalPrecision(decimal_precision);
      v_speed = (float)((uint)v_speed & -(uint)(fVar15 <= v_speed) |
                       ~-(uint)(fVar15 <= v_speed) & (uint)fVar15);
    }
  }
  fVar16 = fVar16 * v_speed;
  fVar15 = fVar16;
  if (uVar11 != 0) {
    fVar15 = -fVar16;
  }
  lVar12 = v_max - v_min;
  if (lVar12 == 0 || v_max < v_min) {
    bVar6 = false;
LAB_0016e2bf:
    bVar4 = false;
  }
  else {
    if ((*v < v_max) || (bVar6 = true, fVar15 <= 0.0)) {
      bVar6 = fVar15 < 0.0 && *v <= v_min;
    }
    if ((bVar1 || bVar13) || bVar2) goto LAB_0016e2bf;
    if ((fVar15 < 0.0) && (0.0 < pIVar5->DragCurrentAccum)) goto LAB_0016e2f4;
    if (fVar15 <= 0.0) goto LAB_0016e2bf;
    bVar4 = pIVar5->DragCurrentAccum <= 0.0 && pIVar5->DragCurrentAccum != 0.0;
  }
  if (((pIVar5->ActiveIdIsJustActivated == false) && (!bVar6)) && (!bVar4)) {
    if ((fVar16 != 0.0) || (NAN(fVar16))) {
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum + fVar15;
      pIVar5->DragCurrentAccumDirty = true;
    }
    else if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((bVar1 || bVar13) || bVar2) {
      lVar9 = *v + (long)pIVar5->DragCurrentAccum;
      local_80 = 0.0;
    }
    else {
      local_80 = pow((double)(*v - v_min) / (double)lVar12,1.0 / (double)power);
      fVar14 = (float)((double)(pIVar5->DragCurrentAccum / (float)lVar12) + local_80);
      fVar16 = 1.0;
      if (fVar14 <= 1.0) {
        fVar16 = fVar14;
      }
      fVar16 = powf((float)(~-(uint)(fVar14 < 0.0) & (uint)fVar16),power);
      lVar9 = (long)fVar16 * lVar12 + v_min;
    }
    lVar9 = RoundScalarWithFormatT<long_long,long_long>(format,data_type,lVar9);
    pIVar5->DragCurrentAccumDirty = false;
    if ((bVar1 || bVar13) || bVar2) {
      lVar12 = *v;
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(lVar9 - lVar12);
    }
    else {
      dVar3 = pow((double)(lVar9 - v_min) / (double)lVar12,1.0 / (double)power);
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(dVar3 - local_80);
      lVar12 = *v;
    }
    if ((v_min < v_max) && (lVar12 != lVar9)) {
      if ((lVar9 < v_min) || (((uVar10 != 8 && (lVar12 < lVar9)) && (fVar15 < 0.0)))) {
        lVar9 = v_min;
      }
      if ((v_max < lVar9) || (((uVar10 != 8 && (lVar9 < lVar12)) && (0.0 < fVar15)))) {
        lVar9 = v_max;
      }
    }
    if (lVar12 == lVar9) {
      return false;
    }
    *v = lVar9;
    return true;
  }
LAB_0016e2f4:
  pIVar5->DragCurrentAccum = 0.0;
  pIVar5->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}